

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_coefficients_to_spectrum.cc
# Opt level: O2

bool __thiscall
sptk::FilterCoefficientsToSpectrum::Run
          (FilterCoefficientsToSpectrum *this,
          vector<double,_std::allocator<double>_> *numerator_coefficients,
          vector<double,_std::allocator<double>_> *denominator_coefficients,
          vector<double,_std::allocator<double>_> *spectrum,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  double dVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  pointer pdVar8;
  int iVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  double *pdVar13;
  ulong uVar14;
  long lVar15;
  pointer pdVar16;
  double __tmp;
  double dVar17;
  
  if (this->is_valid_ == true) {
    iVar2 = this->num_numerator_order_;
    lVar11 = (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    if (((lVar11 == (long)iVar2 + 1) && (buffer != (Buffer *)0x0)) &&
       (spectrum != (vector<double,_std::allocator<double>_> *)0x0)) {
      iVar3 = this->num_denominator_order_;
      lVar15 = (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>)
                     ._M_impl.super__Vector_impl_data._M_start;
      if (lVar15 >> 3 == (long)iVar3 + 1) {
        iVar9 = this->fft_length_;
        iVar6 = iVar9 / 2;
        uVar7 = iVar6 + 1;
        uVar14 = (ulong)(int)uVar7;
        if ((long)(spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3 != uVar14) {
          std::vector<double,_std::allocator<double>_>::resize(spectrum,uVar14);
          iVar9 = this->fft_length_;
        }
        this_00 = &buffer->fast_fourier_transform_input_;
        if ((ulong)((long)(buffer->fast_fourier_transform_input_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(buffer->fast_fourier_transform_input_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) < (ulong)(long)iVar9) {
          std::vector<double,_std::allocator<double>_>::resize(this_00,(long)iVar9);
        }
        this_01 = &buffer->numerator_of_transfer_function_;
        if ((ulong)((long)(buffer->numerator_of_transfer_function_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(buffer->numerator_of_transfer_function_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) < uVar14) {
          std::vector<double,_std::allocator<double>_>::resize(this_01,uVar14);
        }
        this_02 = &buffer->denominator_of_transfer_function_;
        if ((ulong)((long)(buffer->denominator_of_transfer_function_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(buffer->denominator_of_transfer_function_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) < uVar14) {
          std::vector<double,_std::allocator<double>_>::resize(this_02,uVar14);
        }
        if (iVar2 != 0) {
          pdVar16 = (numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar8 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          sVar10 = (long)(numerator_coefficients->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar16;
          if (sVar10 != 0) {
            memmove(pdVar8,pdVar16,sVar10);
            pdVar8 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          }
          pdVar16 = (buffer->fast_fourier_transform_input_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          for (pdVar8 = pdVar8 + lVar11; pdVar8 != pdVar16; pdVar8 = pdVar8 + 1) {
            *pdVar8 = 0.0;
          }
          bVar5 = RealValuedFastFourierTransform::Run
                            (&this->fast_fourier_transform_,this_00,
                             &buffer->fast_fourier_transform_real_output_,
                             &buffer->fast_fourier_transform_imaginary_output_,
                             &buffer->fast_fourier_transform_buffer_);
          if (!bVar5) {
            return false;
          }
          pdVar8 = (buffer->fast_fourier_transform_real_output_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar16 = (buffer->fast_fourier_transform_imaginary_output_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar4 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar12 = 0;
          uVar14 = 0;
          if (0 < (int)uVar7) {
            uVar14 = (ulong)uVar7;
          }
          for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
            dVar17 = pdVar8[uVar12];
            dVar1 = pdVar16[uVar12];
            pdVar4[uVar12] = dVar17 * dVar17 + dVar1 * dVar1;
          }
        }
        pdVar13 = (denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (iVar3 == 0) {
LAB_00111d77:
          dVar17 = *pdVar13 * *pdVar13;
          if ((dVar17 != 0.0) || (NAN(dVar17))) {
            if (iVar2 == 0 && iVar3 == 0) {
              dVar1 = *(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>)
                       ._M_impl.super__Vector_impl_data._M_start;
              pdVar16 = (spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
              for (pdVar8 = (spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start; pdVar8 != pdVar16; pdVar8 = pdVar8 + 1
                  ) {
                *pdVar8 = dVar17 * dVar1 * dVar1;
              }
            }
            else if (iVar3 == 0 || iVar2 != 0) {
              pdVar8 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              if (iVar2 == 0 || iVar3 != 0) {
                pdVar16 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar4 = (spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                for (lVar11 = 0; (long)iVar6 * 8 + 8 != lVar11; lVar11 = lVar11 + 8) {
                  *(double *)((long)pdVar4 + lVar11) =
                       (*(double *)((long)pdVar8 + lVar11) * dVar17) /
                       *(double *)((long)pdVar16 + lVar11);
                }
              }
              else {
                pdVar16 = (spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                for (lVar11 = 0; (long)iVar6 * 8 + 8 != lVar11; lVar11 = lVar11 + 8) {
                  *(double *)((long)pdVar16 + lVar11) = *(double *)((long)pdVar8 + lVar11) * dVar17;
                }
              }
            }
            else {
              dVar1 = *(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>)
                       ._M_impl.super__Vector_impl_data._M_start;
              pdVar8 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar16 = (spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              for (lVar11 = 0; (long)iVar6 * 8 + 8 != lVar11; lVar11 = lVar11 + 8) {
                *(double *)((long)pdVar16 + lVar11) =
                     (dVar17 * dVar1 * dVar1) / *(double *)((long)pdVar8 + lVar11);
              }
            }
            bVar5 = SpectrumToSpectrum::Run(&this->spectrum_to_spectrum_,spectrum);
            return bVar5;
          }
        }
        else {
          pdVar8 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          *pdVar8 = 1.0;
          sVar10 = (long)(denominator_coefficients->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)(pdVar13 + 1);
          if (sVar10 != 0) {
            memmove(pdVar8 + 1,pdVar13 + 1,sVar10);
          }
          pdVar8 = (buffer->fast_fourier_transform_input_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pdVar16 = (pointer)(lVar15 + (long)(buffer->fast_fourier_transform_input_).
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
              pdVar16 != pdVar8; pdVar16 = pdVar16 + 1) {
            *pdVar16 = 0.0;
          }
          bVar5 = RealValuedFastFourierTransform::Run
                            (&this->fast_fourier_transform_,this_00,
                             &buffer->fast_fourier_transform_real_output_,
                             &buffer->fast_fourier_transform_imaginary_output_,
                             &buffer->fast_fourier_transform_buffer_);
          if (bVar5) {
            pdVar8 = (buffer->fast_fourier_transform_real_output_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar16 = (buffer->fast_fourier_transform_imaginary_output_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar4 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar12 = 0;
            uVar14 = (ulong)uVar7;
            if ((int)uVar7 < 1) {
              uVar14 = uVar12;
            }
            do {
              if (uVar14 == uVar12) {
                pdVar13 = (denominator_coefficients->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                goto LAB_00111d77;
              }
              dVar17 = pdVar8[uVar12];
              dVar1 = pdVar16[uVar12];
              dVar17 = dVar17 * dVar17 + dVar1 * dVar1;
              pdVar4[uVar12] = dVar17;
              uVar12 = uVar12 + 1;
            } while ((dVar17 != 0.0) || (NAN(dVar17)));
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool FilterCoefficientsToSpectrum::Run(
    const std::vector<double>& numerator_coefficients,
    const std::vector<double>& denominator_coefficients,
    std::vector<double>* spectrum,
    FilterCoefficientsToSpectrum::Buffer* buffer) const {
  // Check inputs.
  const int numerator_length(num_numerator_order_ + 1);
  const int denominator_length(num_denominator_order_ + 1);
  if (!is_valid_ ||
      numerator_coefficients.size() !=
          static_cast<std::size_t>(numerator_length) ||
      denominator_coefficients.size() !=
          static_cast<std::size_t>(denominator_length) ||
      NULL == spectrum || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(fft_length_ / 2 + 1);
  if (spectrum->size() != static_cast<std::size_t>(output_length)) {
    spectrum->resize(output_length);
  }
  if (buffer->fast_fourier_transform_input_.size() <
      static_cast<std::size_t>(fft_length_)) {
    buffer->fast_fourier_transform_input_.resize(fft_length_);
  }
  if (buffer->numerator_of_transfer_function_.size() <
      static_cast<std::size_t>(output_length)) {
    buffer->numerator_of_transfer_function_.resize(output_length);
  }
  if (buffer->denominator_of_transfer_function_.size() <
      static_cast<std::size_t>(output_length)) {
    buffer->denominator_of_transfer_function_.resize(output_length);
  }

  // Calculate numerators of transfer function.
  if (1 != numerator_length) {
    std::copy(numerator_coefficients.begin(), numerator_coefficients.end(),
              buffer->fast_fourier_transform_input_.begin());
    std::fill(buffer->fast_fourier_transform_input_.begin() + numerator_length,
              buffer->fast_fourier_transform_input_.end(), 0.0);
    if (!fast_fourier_transform_.Run(
            buffer->fast_fourier_transform_input_,
            &buffer->fast_fourier_transform_real_output_,
            &buffer->fast_fourier_transform_imaginary_output_,
            &buffer->fast_fourier_transform_buffer_)) {
      return false;
    }

    const double* xr(&buffer->fast_fourier_transform_real_output_[0]);
    const double* xi(&buffer->fast_fourier_transform_imaginary_output_[0]);
    double* x(&buffer->numerator_of_transfer_function_[0]);
    for (int i(0); i < output_length; ++i) {
      x[i] = xr[i] * xr[i] + xi[i] * xi[i];
    }
  }

  // Calculate denominators of transfer function.
  if (1 != denominator_length) {
    buffer->fast_fourier_transform_input_[0] = 1.0;
    std::copy(denominator_coefficients.begin() + 1,
              denominator_coefficients.end(),
              buffer->fast_fourier_transform_input_.begin() + 1);
    std::fill(
        buffer->fast_fourier_transform_input_.begin() + denominator_length,
        buffer->fast_fourier_transform_input_.end(), 0.0);
    if (!fast_fourier_transform_.Run(
            buffer->fast_fourier_transform_input_,
            &buffer->fast_fourier_transform_real_output_,
            &buffer->fast_fourier_transform_imaginary_output_,
            &buffer->fast_fourier_transform_buffer_)) {
      return false;
    }

    const double* yr(&buffer->fast_fourier_transform_real_output_[0]);
    const double* yi(&buffer->fast_fourier_transform_imaginary_output_[0]);
    double* y(&buffer->denominator_of_transfer_function_[0]);
    for (int i(0); i < output_length; ++i) {
      y[i] = yr[i] * yr[i] + yi[i] * yi[i];
      if (0.0 == y[i]) {
        return false;
      }
    }
  }

  // Get gain of transfer function.
  const double gain(denominator_coefficients[0] * denominator_coefficients[0]);
  if (0.0 == gain) {
    return false;
  }

  // Calculate power spectrum.
  if (1 == numerator_length && 1 == denominator_length) {
    const double tmp(gain * numerator_coefficients[0] *
                     numerator_coefficients[0]);
    std::fill(spectrum->begin(), spectrum->end(), tmp);
  } else if (1 == numerator_length && 1 != denominator_length) {
    const double tmp(gain * numerator_coefficients[0] *
                     numerator_coefficients[0]);
    std::transform(
        buffer->denominator_of_transfer_function_.begin(),
        buffer->denominator_of_transfer_function_.begin() + output_length,
        spectrum->begin(), [tmp](double y) { return tmp / y; });
  } else if (1 != numerator_length && 1 == denominator_length) {
    std::transform(
        buffer->numerator_of_transfer_function_.begin(),
        buffer->numerator_of_transfer_function_.begin() + output_length,
        spectrum->begin(), [gain](double x) { return gain * x; });
  } else {
    std::transform(
        buffer->numerator_of_transfer_function_.begin(),
        buffer->numerator_of_transfer_function_.begin() + output_length,
        buffer->denominator_of_transfer_function_.begin(), spectrum->begin(),
        [gain](double x, double y) { return gain * x / y; });
  }

  if (!spectrum_to_spectrum_.Run(spectrum)) {
    return false;
  }

  return true;
}